

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  vector<crnlib::vec<2U,_float>_> *this_00;
  vector<double> *this_01;
  hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
  *this_02;
  node_vec_type *this_03;
  undefined8 uVar1;
  ulong uVar2;
  bool bVar3;
  uint i;
  ulong uVar4;
  uint uVar5;
  vq_node *pvVar6;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo> *this_04;
  uint task;
  void *pData_ptr;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  float val;
  float fVar11;
  float fVar12;
  double dVar13;
  uint end_node;
  tree_clusterizer<crnlib::vec<2U,_float>_> *local_128;
  uint local_11c;
  double local_118;
  ulong local_110;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
  params;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  node_queue;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  alternative_node_queue;
  vq_node root;
  pair<crnlib::vec<2U,_float>,_int> local_3c;
  
  this->m_vectors = vectors;
  this_04 = &this->m_vectorsInfo;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo>::resize(this_04,size,false);
  this_00 = &this->m_weightedVectors;
  vector<crnlib::vec<2U,_float>_>::resize(this_00,size,false);
  this_01 = &this->m_weightedDotProducts;
  vector<double>::resize(this_01,size,false);
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo>::resize
            (&this->m_vectorsInfoLeft,size,false);
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo>::resize
            (&this->m_vectorsInfoRight,size,false);
  vector<bool>::resize(&this->m_vectorComparison,size,false);
  this_03 = &this->m_nodes;
  local_110 = (ulong)max_splits;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::vq_node>::resize
            (this_03,max_splits * 4,false);
  local_128 = this;
  vector<crnlib::vec<2U,_float>_>::clear(&this->m_codebook);
  if (pTask_pool == (task_pool *)0x0) {
    local_11c = 1;
  }
  else {
    local_11c = pTask_pool->m_num_threads + 1;
  }
  root.m_centroid.m_s[0] = 0.0;
  root.m_centroid.m_s[1] = 0.0;
  root.m_total_weight = 0;
  root.m_left = -1;
  root.m_right = -1;
  root.m_codebook_index = -1;
  root.m_unsplittable = false;
  root.m_alternative = false;
  root.m_processed = false;
  root.m_begin = 0;
  dVar13 = 0.0;
  lVar9 = 0;
  root.m_end = size;
  for (uVar4 = 0; uVar2 = local_110, uVar4 < (local_128->m_vectorsInfo).m_size; uVar4 = uVar4 + 1) {
    *(int *)((long)&this_04->m_p->index + lVar9) = (int)uVar4;
    uVar7 = weights[uVar4];
    *(uint *)((long)&this_04->m_p->weight + lVar9) = uVar7;
    val = (float)uVar7;
    local_118 = dVar13;
    operator*((vec<2U,_float> *)((long)vectors->m_s + lVar9),val);
    vec<2U,_float>::operator=
              ((vec<2U,_float> *)((long)this_00->m_p->m_s + lVar9),(vec<2U,_float> *)&node_queue);
    vec<2U,_float>::operator+=(&root.m_centroid,(vec<2U,_float> *)((long)this_00->m_p->m_s + lVar9))
    ;
    root.m_total_weight = root.m_total_weight + uVar7;
    uVar1 = *(undefined8 *)((long)vectors->m_s + lVar9);
    fVar11 = (float)uVar1;
    fVar12 = (float)((ulong)uVar1 >> 0x20);
    *(double *)((long)this_01->m_p + lVar9) = (double)((fVar12 * fVar12 + fVar11 * fVar11) * val);
    dVar13 = local_118 + *(double *)((long)this_01->m_p + lVar9);
    lVar9 = lVar9 + 8;
  }
  uVar7 = (uint)local_110;
  root.m_variance =
       (float)(dVar13 - (double)((root.m_centroid.m_s[1] * root.m_centroid.m_s[1] +
                                 root.m_centroid.m_s[0] * root.m_centroid.m_s[0]) /
                                (float)root.m_total_weight));
  vec<2U,_float>::operator*=(&root.m_centroid,1.0 / (float)root.m_total_weight);
  node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  end_node = 0;
  vq_node::operator=(this_03->m_p,&root);
  alternative_node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = end_node;
  alternative_node_queue.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = root.m_variance;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ::push(&node_queue,(value_type *)&alternative_node_queue);
  end_node = end_node + 1;
  if (local_11c < 2) {
    uVar5 = 1;
  }
  else {
    local_118 = (double)CONCAT44(local_118._4_4_,uVar7 + (uVar7 == 0));
    uVar4 = (ulong)local_11c;
    for (uVar5 = 1; uVar5 < uVar7; uVar5 = uVar5 + 1) {
      if (((long)node_queue.c.
                 super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)node_queue.c.
                 super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar4) ||
         (bVar3 = split_node(local_128,&node_queue,&end_node,pTask_pool), !bVar3))
      goto LAB_0016ceb3;
    }
    uVar5 = local_118._0_4_;
LAB_0016ceb3:
    if ((long)node_queue.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)node_queue.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar4) {
      std::
      vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ::vector(&alternative_node_queue.c,&node_queue.c);
      pData_ptr = (void *)0x0;
      uVar4 = (ulong)local_11c;
      vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
      ::vector(&params,local_11c);
      uVar8 = uVar7 * 2;
      uVar10 = (uint)((uVar2 & 0xffffffff) / uVar4);
      while ((pointer)CONCAT44(alternative_node_queue.c.
                               super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (uint)alternative_node_queue.c.
                                     super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_start) !=
             alternative_node_queue.c.
             super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        params.m_p[(long)pData_ptr].main_node =
             ((pointer)
             CONCAT44(alternative_node_queue.c.
                      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      (uint)alternative_node_queue.c.
                            super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start))->m_index;
        params.m_p[(long)pData_ptr].alternative_node = uVar8;
        params.m_p[(long)pData_ptr].max_splits = uVar10;
        task_pool::
        queue_object_task<crnlib::tree_clusterizer<crnlib::vec<2u,float>>,void(crnlib::tree_clusterizer<crnlib::vec<2u,float>>::*)(unsigned_long_long,void*)>
                  (pTask_pool,local_128,0x17237e,0,pData_ptr);
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
        ::pop(&alternative_node_queue);
        uVar8 = uVar8 + uVar10 * 2;
        pData_ptr = (void *)(ulong)((int)pData_ptr + 1);
      }
      task_pool::join(pTask_pool);
      vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
      ::~vector(&params);
      std::
      _Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ::~_Vector_base((_Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                       *)&alternative_node_queue);
      uVar7 = (uint)local_110;
    }
  }
  uVar5 = uVar5 - 1;
  do {
    uVar5 = uVar5 + 1;
    if (uVar7 <= uVar5) break;
    bVar3 = split_node(local_128,&node_queue,&end_node,pTask_pool);
  } while (bVar3);
  this_02 = &local_128->m_node_index_map;
  dVar13 = 0.0;
  while ((ulong)dVar13 < (ulong)end_node) {
    pvVar6 = this_03->m_p;
    local_118 = dVar13;
    if ((pvVar6[(long)dVar13].m_alternative != false) || (pvVar6[(long)dVar13].m_left == -1)) {
      pvVar6 = pvVar6 + (long)dVar13;
      pvVar6->m_codebook_index = (local_128->m_codebook).m_size;
      vector<crnlib::vec<2U,_float>_>::push_back(&this->m_codebook,&pvVar6->m_centroid);
      if (generate_node_index_map) {
        for (uVar4 = (ulong)pvVar6->m_begin; uVar4 < pvVar6->m_end; uVar4 = uVar4 + 1) {
          std::pair<crnlib::vec<2U,_float>,_int>::pair<crnlib::vec<2U,_float>_&,_int_&,_true>
                    (&local_3c,local_128->m_vectors + (local_128->m_vectorsInfo).m_p[uVar4].index,
                     &pvVar6->m_codebook_index);
          std::pair<crnlib::vec<2U,_float>,_unsigned_int>::pair<crnlib::vec<2U,_float>,_int,_true>
                    ((pair<crnlib::vec<2U,_float>,_unsigned_int> *)&params,&local_3c);
          hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
          ::insert((insert_result *)&alternative_node_queue,this_02,(value_type *)&params);
        }
      }
    }
    dVar13 = (double)((long)local_118 + 1);
  }
  std::
  _Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ::~_Vector_base((_Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                   *)&node_queue);
  return;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0) {
    m_vectors = vectors;
    m_vectorsInfo.resize(size);
    m_weightedVectors.resize(size);
    m_weightedDotProducts.resize(size);
    m_vectorsInfoLeft.resize(size);
    m_vectorsInfoRight.resize(size);
    m_vectorComparison.resize(size);
    m_nodes.resize(max_splits << 2);
    m_codebook.clear();
    uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

    vq_node root;
    root.m_begin = 0;
    root.m_end = size;
    double ttsum = 0.0f;
    for (uint i = 0; i < m_vectorsInfo.size(); i++) {
      const VectorType& v = vectors[i];
      m_vectorsInfo[i].index = i;
      const uint weight = m_vectorsInfo[i].weight = weights[i];
      m_weightedVectors[i] = v * (float)weight;
      root.m_centroid += m_weightedVectors[i];
      root.m_total_weight += weight;
      m_weightedDotProducts[i] = v.dot(v) * weight;
      ttsum += m_weightedDotProducts[i];
    }
    root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
    root.m_centroid *= (1.0f / root.m_total_weight);

    std::priority_queue<NodeInfo> node_queue;
    uint begin_node = 0, end_node = begin_node, splits = 0;
    m_nodes[end_node] = root;
    node_queue.push(NodeInfo(end_node, root.m_variance));
    end_node++;
    splits++;

    if (num_tasks > 1) {
      while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
        splits++;
      if (node_queue.size() == num_tasks) {
        std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
        uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
        crnlib::vector<split_alternative_node_task_params> params(num_tasks);
        for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++) {
          params[task].main_node = alternative_node_queue.top().m_index;
          params[task].alternative_node = alternative_node;
          params[task].max_splits = alternative_max_splits;
          pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
        }
        pTask_pool->join();
      }
    }

    while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
      splits++;

    for (uint i = begin_node; i < end_node; i++) {
      vq_node& node = m_nodes[i];
      if (!node.m_alternative && node.m_left != -1)
        continue;
      node.m_codebook_index = m_codebook.size();
      m_codebook.push_back(node.m_centroid);
      if (generate_node_index_map) {
        for (uint j = node.m_begin; j < node.m_end; j++)
          m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
      }
    }
  }